

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O3

void AdjustPusher(int tag,int magnitude,int angle,bool wind)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint affectee;
  DPusher *pDVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  FThinkerCollection *pFVar6;
  EPusher type;
  ulong uVar7;
  TArray<FThinkerCollection,_FThinkerCollection> Collection;
  FSectorTagIterator itr;
  TArray<FThinkerCollection,_FThinkerCollection> local_58;
  FThinkerIterator local_48;
  
  local_58.Array = (FThinkerCollection *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  FThinkerIterator::FThinkerIterator(&local_48,DPusher::RegistrationInfo.MyClass,0x80);
  type = (EPusher)CONCAT71(in_register_00000009,wind) ^ p_current;
  while (pDVar4 = (DPusher *)FThinkerIterator::Next(&local_48), uVar2 = local_58.Count,
        pDVar4 != (DPusher *)0x0) {
    if (pDVar4->m_Type == type) {
      bVar3 = FTagManager::SectorHasTag(&tagManager,pDVar4->m_Affectee,tag);
      iVar1 = pDVar4->m_Affectee;
      if (bVar3 && -1 < iVar1) {
        DPusher::ChangeValues(pDVar4,magnitude,angle);
        TArray<FThinkerCollection,_FThinkerCollection>::Grow(&local_58,1);
        local_58.Array[local_58.Count].RefNum = iVar1;
        local_58.Array[local_58.Count].Obj = (DThinker *)pDVar4;
        local_58.Count = local_58.Count + 1;
      }
    }
  }
  uVar7 = (ulong)local_58.Count;
  if (tag == 0) {
    local_48.m_ParentType._4_4_ = 0;
  }
  else {
    local_48.m_ParentType._4_4_ = tagManager.TagHashFirst[tag & 0xff];
  }
  local_48.m_ParentType._0_4_ = tag;
LAB_0055c0a3:
  affectee = FSectorTagIterator::Next((FSectorTagIterator *)&local_48);
  if ((int)affectee < 0) {
    TArray<FThinkerCollection,_FThinkerCollection>::~TArray(&local_58);
    return;
  }
  if (uVar7 == 0) goto LAB_0055c0eb;
  uVar5 = 0;
  pFVar6 = local_58.Array;
  do {
    if (pFVar6->RefNum == sectors[affectee].sectornum) goto LAB_0055c0ed;
    uVar5 = uVar5 + 1;
    pFVar6 = pFVar6 + 1;
  } while (uVar7 != uVar5);
  goto LAB_0055c0f1;
LAB_0055c0eb:
  uVar5 = 0;
LAB_0055c0ed:
  if ((uint)uVar5 == uVar2) {
LAB_0055c0f1:
    pDVar4 = (DPusher *)
             M_Malloc_Dbg(0x70,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                          ,0x1f7);
    DPusher::DPusher(pDVar4,type,(line_t *)0x0,magnitude,angle,(AActor *)0x0,affectee);
  }
  goto LAB_0055c0a3;
}

Assistant:

void AdjustPusher (int tag, int magnitude, int angle, bool wind)
{
	DPusher::EPusher type = wind? DPusher::p_wind : DPusher::p_current;
	
	// Find pushers already attached to the sector, and change their parameters.
	TArray<FThinkerCollection> Collection;
	{
		TThinkerIterator<DPusher> iterator;
		FThinkerCollection collect;

		while ( (collect.Obj = iterator.Next ()) )
		{
			if ((collect.RefNum = ((DPusher *)collect.Obj)->CheckForSectorMatch (type, tag)) >= 0)
			{
				((DPusher *)collect.Obj)->ChangeValues (magnitude, angle);
				Collection.Push (collect);
			}
		}
	}

	size_t numcollected = Collection.Size ();
	int secnum;

	// Now create pushers for any sectors that don't already have them.
	FSectorTagIterator itr(tag);
	while ((secnum = itr.Next()) >= 0)
	{
		unsigned int i;
		for (i = 0; i < numcollected; i++)
		{
			if (Collection[i].RefNum == sectors[secnum].sectornum)
				break;
		}
		if (i == numcollected)
		{
			new DPusher (type, NULL, magnitude, angle, NULL, secnum);
		}
	}
}